

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::keyframe(Mesh *this,double t)

{
  Vector3D local_68;
  Vector3D local_48;
  Vector3D local_28;
  
  local_28.x = (this->super_SceneObject).position.x;
  local_28.y = (this->super_SceneObject).position.y;
  local_28.z = (this->super_SceneObject).position.z;
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).positions,t,&local_28);
  local_48.x = (this->super_SceneObject).rotation.x;
  local_48.y = (this->super_SceneObject).rotation.y;
  local_48.z = (this->super_SceneObject).rotation.z;
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).rotations,t,&local_48);
  local_68.x = (this->super_SceneObject).scale.x;
  local_68.y = (this->super_SceneObject).scale.y;
  local_68.z = (this->super_SceneObject).scale.z;
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).scales,t,&local_68);
  if (this->skeleton != (Skeleton *)0x0) {
    Skeleton::keyframe(this->skeleton,t);
  }
  return;
}

Assistant:

void Mesh::keyframe(double t) {
  positions.setValue(t, position);
  rotations.setValue(t, rotation);
  scales.setValue(t, scale);
  if (skeleton) skeleton->keyframe(t);
}